

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixCurrentTimeInt64(sqlite3_vfs *NotUsed,sqlite3_int64 *piNow)

{
  undefined1 local_30 [8];
  timeval sNow;
  int rc;
  sqlite3_int64 *piNow_local;
  sqlite3_vfs *NotUsed_local;
  
  sNow.tv_usec._4_4_ = 0;
  gettimeofday((timeval *)local_30,(__timezone_ptr_t)0x0);
  *piNow = (long)local_30 * 1000 + 0xbfc83e532200 + sNow.tv_sec / 1000;
  return sNow.tv_usec._4_4_;
}

Assistant:

static int unixCurrentTimeInt64(sqlite3_vfs *NotUsed, sqlite3_int64 *piNow){
  static const sqlite3_int64 unixEpoch = 24405875*(sqlite3_int64)8640000;
  int rc = SQLITE_OK;
#if defined(NO_GETTOD)
  time_t t;
  time(&t);
  *piNow = ((sqlite3_int64)t)*1000 + unixEpoch;
#elif OS_VXWORKS
  struct timespec sNow;
  clock_gettime(CLOCK_REALTIME, &sNow);
  *piNow = unixEpoch + 1000*(sqlite3_int64)sNow.tv_sec + sNow.tv_nsec/1000000;
#else
  struct timeval sNow;
  (void)gettimeofday(&sNow, 0);  /* Cannot fail given valid arguments */
  *piNow = unixEpoch + 1000*(sqlite3_int64)sNow.tv_sec + sNow.tv_usec/1000;
#endif

#ifdef SQLITE_TEST
  if( sqlite3_current_time ){
    *piNow = 1000*(sqlite3_int64)sqlite3_current_time + unixEpoch;
  }
#endif
  UNUSED_PARAMETER(NotUsed);
  return rc;
}